

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

Expression *
slang::ast::Expression::bindRefArg
          (Type *lhs,bitmask<slang::ast::VariableFlags> argFlags,ExpressionSyntax *rhs,
          SourceLocation location,ASTContext *context)

{
  Compilation *compilation;
  SourceRange range;
  SourceRange range_00;
  bool bVar1;
  DiagCode DVar2;
  ASTContext *context_00;
  Type *pTVar3;
  Symbol *symbol;
  Diagnostic *pDVar4;
  InvalidExpression *pIVar5;
  uint uVar6;
  DiagCode code;
  undefined6 in_register_00000032;
  undefined1 disallowDynamicArrays;
  ASTContext *pAVar7;
  ASTContext *local_38;
  
  compilation = ((context->scope).ptr)->compilation;
  pAVar7 = context;
  context_00 = (ASTContext *)
               selfDetermined(compilation,rhs,context,(bitmask<slang::ast::ASTFlags>)0x0);
  disallowDynamicArrays = SUB81(pAVar7,0);
  bVar1 = bad((Expression *)context_00);
  if (bVar1) {
    return (Expression *)context_00;
  }
  pTVar3 = lhs->canonical;
  if (pTVar3 == (Type *)0x0) {
    Type::resolveCanonical(lhs);
    pTVar3 = lhs->canonical;
  }
  if ((pTVar3->super_Symbol).kind == ErrorType) goto LAB_002c2001;
  uVar6 = (uint)CONCAT62(in_register_00000032,argFlags.m_bits);
  bVar1 = canConnectToRefArg(context_00,
                             (Expression *)
                             (CONCAT62(in_register_00000032,argFlags.m_bits) & 0xffffffff),
                             (bitmask<slang::ast::VariableFlags>)0x0,false,
                             (bool)disallowDynamicArrays);
  if (bVar1) {
    bVar1 = Type::isEquivalent(lhs,*(Type **)&context_00->lookupIndex);
    if (bVar1) {
      if ((argFlags.m_bits & 1) != 0) {
        return (Expression *)context_00;
      }
      requireLValue((Expression *)context_00,context,(SourceLocation)0x0,
                    (bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0);
      symbol = getSymbolReference((Expression *)context_00,true);
      if (symbol == (Symbol *)0x0) {
        return (Expression *)context_00;
      }
      Compilation::noteReference(compilation,symbol,true);
      return (Expression *)context_00;
    }
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0x920007,location);
    range_00.startLoc = (SourceLocation)context_00->firstTempVar;
    range_00.endLoc = (SourceLocation)context_00->randomizeDetails;
    pDVar4 = Diagnostic::operator<<(pDVar4,range_00);
    pDVar4 = ast::operator<<(pDVar4,*(Type **)&context_00->lookupIndex);
    ast::operator<<(pDVar4,lhs);
    goto LAB_002c2001;
  }
  if ((argFlags.m_bits & 1) == 0) {
    bVar1 = canConnectToRefArg(context_00,(Expression *)(ulong)(uVar6 | 1),
                               (bitmask<slang::ast::VariableFlags>)0x0,false,
                               (bool)disallowDynamicArrays);
    code.subsystem = Expressions;
    code.code = 0x43;
    if (!bVar1) goto LAB_002c1f82;
  }
  else {
LAB_002c1f82:
    code.subsystem = Expressions;
    code.code = 0x66;
    if ((argFlags.m_bits & 0x20) != 0) {
      bVar1 = canConnectToRefArg(context_00,(Expression *)(ulong)(uVar6 & 0x1f),
                                 (bitmask<slang::ast::VariableFlags>)0x0,false,
                                 (bool)disallowDynamicArrays);
      DVar2.subsystem = Expressions;
      DVar2.code = 0x1c;
      code.subsystem = Expressions;
      code.code = 0x66;
      if (bVar1) {
        code = DVar2;
      }
    }
  }
  pDVar4 = ASTContext::addDiag(context,code,location);
  range.startLoc = (SourceLocation)context_00->firstTempVar;
  range.endLoc = (SourceLocation)context_00->randomizeDetails;
  Diagnostic::operator<<(pDVar4,range);
LAB_002c2001:
  local_38 = context_00;
  pIVar5 = BumpAllocator::
           emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                     (&compilation->super_BumpAllocator,(Expression **)&local_38,
                      compilation->errorType);
  return &pIVar5->super_Expression;
}

Assistant:

const Expression& Expression::bindRefArg(const Type& lhs, bitmask<VariableFlags> argFlags,
                                         const ExpressionSyntax& rhs, SourceLocation location,
                                         const ASTContext& context) {
    Compilation& comp = context.getCompilation();
    Expression& expr = selfDetermined(comp, rhs, context);
    if (expr.bad())
        return expr;

    if (lhs.isError())
        return badExpr(comp, &expr);

    const bool isConstRef = argFlags.has(VariableFlags::Const);
    if (!canConnectToRefArg(context, expr, argFlags)) {
        DiagCode code = diag::InvalidRefArg;
        if (!isConstRef && canConnectToRefArg(context, expr, argFlags | VariableFlags::Const)) {
            // If we can't bind to ref but we can bind to 'const ref', issue a more
            // specific error about constness.
            code = diag::ConstVarToRef;
        }
        else if (argFlags.has(VariableFlags::RefStatic) &&
                 canConnectToRefArg(context, expr, argFlags & ~VariableFlags::RefStatic)) {
            // Same idea, but for ref static restrictions.
            code = diag::AutoVarToRefStatic;
        }

        context.addDiag(code, location) << expr.sourceRange;
        return badExpr(comp, &expr);
    }

    if (!lhs.isEquivalent(*expr.type)) {
        auto& diag = context.addDiag(diag::RefTypeMismatch, location) << expr.sourceRange;
        diag << *expr.type << lhs;
        return badExpr(comp, &expr);
    }

    // ref args are considered drivers unless they are const.
    if (!isConstRef) {
        // The check for ref-args is more strict than the check for lvalues,
        // so the net effect of this call is to get a driver registered for
        // us without duplicating the logic for determining longest static prefix.
        expr.requireLValue(context);
        if (auto sym = expr.getSymbolReference())
            comp.noteReference(*sym, /* isLValue */ true);
    }

    return expr;
}